

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O0

Read<signed_char> __thiscall
Omega_h::fan_reduce<long>(Omega_h *this,LOs *a2b,Read<signed_char> *b_data,Int width,Omega_h_Op op)

{
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *pvVar1;
  Read<signed_char> RVar2;
  Read<long> local_98;
  Read<int> local_88;
  Read<long> local_78;
  Read<int> local_68 [2];
  Read<long> local_48;
  Read<int> local_38;
  Omega_h_Op local_28;
  Int local_24;
  Omega_h_Op op_local;
  Int width_local;
  Read<signed_char> *b_data_local;
  LOs *a2b_local;
  
  local_28 = op;
  local_24 = width;
  _op_local = b_data;
  b_data_local = (Read<signed_char> *)a2b;
  a2b_local = (LOs *)this;
  if (op == OMEGA_H_MIN) {
    Read<int>::Read(&local_38,a2b);
    Read<long>::Read(&local_48,(Read<int> *)b_data);
    fan_reduce_tmpl<Omega_h::MinFunctor<long>>
              (this,&local_38,(Read<signed_char> *)&local_48,local_24);
    Read<long>::~Read(&local_48);
    Read<int>::~Read(&local_38);
    pvVar1 = extraout_RDX;
  }
  else if (op == OMEGA_H_MAX) {
    Read<int>::Read(local_68,a2b);
    Read<long>::Read(&local_78,(Read<int> *)b_data);
    fan_reduce_tmpl<Omega_h::MaxFunctor<long>>
              (this,local_68,(Read<signed_char> *)&local_78,local_24);
    Read<long>::~Read(&local_78);
    Read<int>::~Read(local_68);
    pvVar1 = extraout_RDX_00;
  }
  else {
    if (op != OMEGA_H_SUM) {
      fail("assertion %s failed at %s +%d\n","false",
           "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
           ,0x144);
    }
    Read<int>::Read(&local_88,a2b);
    Read<long>::Read(&local_98,(Read<int> *)b_data);
    fan_reduce_tmpl<Omega_h::SumFunctor<long>>
              (this,&local_88,(Read<signed_char> *)&local_98,local_24);
    Read<long>::~Read(&local_98);
    Read<int>::~Read(&local_88);
    pvVar1 = extraout_RDX_01;
  }
  RVar2.write_.shared_alloc_.direct_ptr = pvVar1;
  RVar2.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar2.write_.shared_alloc_;
}

Assistant:

Read<T> fan_reduce(LOs a2b, Read<T> b_data, Int width, Omega_h_Op op) {
  switch (op) {
    case OMEGA_H_MIN:
      return fan_reduce_tmpl<MinFunctor<T>>(a2b, b_data, width);
    case OMEGA_H_MAX:
      return fan_reduce_tmpl<MaxFunctor<T>>(a2b, b_data, width);
    case OMEGA_H_SUM:
      return fan_reduce_tmpl<SumFunctor<T>>(a2b, b_data, width);
  }
  OMEGA_H_NORETURN(Read<T>());
}